

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall Validator_resetEmptyMathML_Test::TestBody(Validator_resetEmptyMathML_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  ValidatorPtr validator;
  ResetPtr r;
  ComponentPtr c;
  VariablePtr v2;
  VariablePtr v1;
  ModelPtr m;
  AssertionResult gtest_ar;
  shared_ptr *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long local_90 [2];
  long *local_80;
  unsigned_long local_78;
  shared_ptr *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Reset::create();
  libcellml::Reset::setVariable(local_70);
  libcellml::Reset::setTestVariable(local_70);
  libcellml::Reset::setOrder((int)local_70);
  libcellml::Reset::setResetValue((string *)local_70);
  libcellml::Reset::setTestValue((string *)local_70);
  psVar1 = local_60;
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"comp","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  psVar1 = local_40;
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"var","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"second","");
  libcellml::Variable::setUnits(local_40);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  psVar1 = local_50;
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"var2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"second","");
  libcellml::Variable::setUnits(local_50);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_60);
  libcellml::Component::addVariable((shared_ptr *)local_60);
  libcellml::Component::addReset((shared_ptr *)local_60);
  psVar1 = local_30;
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"main","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_30);
  libcellml::Validator::create();
  libcellml::Validator::validateModel(local_a0);
  local_80 = (long *)0x0;
  local_78 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_20,"size_t(0)","validator->issueCount()",(unsigned_long *)&local_80,&local_78);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
               ,0x603,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Validator, resetEmptyMathML)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Empty test_value and reset_value math block
    // TODO: For now, empty maths blocks are valid. Issue #365.
    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(9);
    r->setResetValue(EMPTY_MATH);
    r->setTestValue(EMPTY_MATH);

    c->setName("comp");
    v1->setName("var");
    v1->setUnits("second");
    v2->setName("var2");
    v2->setUnits("second");

    c->addVariable(v1);
    c->addVariable(v2);

    c->addReset(r);

    m->setName("main");
    m->addComponent(c);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(m);

    EXPECT_EQ(size_t(0), validator->issueCount());
}